

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O1

void __thiscall
cppcms::impl::
handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
::handler_binder_p1(handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
                    *this,offset_in_connection_to_subr *f,
                   shared_ptr<cppcms::impl::cgi::connection> *s,callback<void_()> *p1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  callable<void_()> *pcVar2;
  offset_in_connection_to_subr oVar3;
  
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__refcounted_00287bd8;
  booster::atomic_counter::atomic_counter(&(this->super_callable_type).super_refcounted.refs_,0);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__handler_binder_p1_00288158;
  oVar3 = f[1];
  this->f_ = *f;
  *(offset_in_connection_to_subr *)&this->field_0x18 = oVar3;
  (this->s_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (s->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (s->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->s_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  pcVar2 = (p1->call_ptr).p_;
  (this->p1_).call_ptr.p_ = pcVar2;
  if (pcVar2 != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  return;
}

Assistant:

handler_binder_p1(F const &f,S const &s, P1 const &p1) : f_(f), s_(s), p1_(p1) {}